

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::NumberPair>
          (BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,NumberPair *key)

{
  Type piVar1;
  NumberPair NVar2;
  uint uVar3;
  int *piVar4;
  Type this_00;
  int iVar5;
  long lVar6;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = GetBucket(this,key->x * 0x20000 + key->y * 2 + 1);
    piVar4 = piVar1 + uVar3;
    uVar3 = 0;
    while( true ) {
      iVar5 = *piVar4;
      lVar6 = (long)iVar5;
      if (lVar6 < 0) break;
      NVar2 = this->entries[lVar6].
              super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>.
              super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
              .super_ValueEntryData<Js::NumberPair>.value;
      if ((key->x == NVar2.x) && (key->y == NVar2.y)) {
        this_00 = this->stats;
        goto LAB_0021a077;
      }
      uVar3 = uVar3 + 1;
      piVar4 = &this->entries[lVar6].
                super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>.
                super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
                .super_ValueEntryData<Js::NumberPair>.next;
    }
  }
  this_00 = this->stats;
  iVar5 = -1;
LAB_0021a077:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return iVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }